

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
          (BasicResult<Catch::clara::detail::ParseState> *this,BasicResult<void> *other)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type =
       (other->super_ResultValueBase<void>).super_ResultBase.m_type;
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_001b3788;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (other->m_errorMessage)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,
             pcVar1 + (other->m_errorMessage)._M_string_length);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O1/tests/catch2/catch.hpp"
                ,0x232b,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = void]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }